

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

int mk_node(dtree_node_t *node,uint32 node_id,uint32 *id,uint32 n_id,float32 ****mixw,
           float32 ****means,float32 ****vars,uint32 *veclen,uint32 n_model,uint32 n_state,
           uint32 n_stream,uint32 n_density,float32 *stwt,float32 mwfloor)

{
  uint uVar1;
  float fVar2;
  int iVar3;
  cmd_ln_t *pcVar4;
  char *__s1;
  float32 ***pppfVar5;
  void *tmpptr;
  void *ptr;
  uint32 *puVar6;
  bool bVar7;
  double dVar8;
  float64 fVar9;
  float32 *local_d8;
  float32 *lvarvec;
  float32 *lmeanvec;
  char *type;
  uint32 sumveclen;
  uint32 continuous;
  float32 varfloor;
  float32 ***lvars;
  float32 ***lmeans;
  uint32 *l_id;
  float32 mx_wt;
  float64 occ;
  float64 s_wt_ent;
  float64 wt_ent;
  float64 norm;
  float64 *dnom;
  uint local_60;
  uint32 k;
  uint32 j;
  uint32 s;
  uint32 m;
  uint32 mm;
  float32 **dist;
  float32 ***mixw_occ;
  float32 mwfloor_local;
  float32 ****means_local;
  float32 ****mixw_local;
  uint32 n_id_local;
  uint32 *id_local;
  uint32 node_id_local;
  dtree_node_t *node_local;
  
  lvars = (float32 ***)0x0;
  _continuous = (float32 ***)0x0;
  sumveclen = 0;
  pcVar4 = cmd_ln_get();
  __s1 = cmd_ln_str_r(pcVar4,"-ts2cbfn");
  iVar3 = strcmp(__s1,".semi.");
  if ((iVar3 != 0) && (iVar3 = strcmp(__s1,".cont."), iVar3 != 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
            ,0x326,"Type %s unsupported; trees can only be built on types .semi. or .cont.\n",__s1);
    exit(1);
  }
  iVar3 = strcmp(__s1,".cont.");
  bVar7 = iVar3 == 0;
  if (bVar7) {
    pcVar4 = cmd_ln_get();
    dVar8 = cmd_ln_float_r(pcVar4,"-varfloor");
    sumveclen = (uint32)(float)dVar8;
    type._4_4_ = 0;
    for (local_60 = 0; local_60 < n_stream; local_60 = local_60 + 1) {
      type._4_4_ = veclen[local_60] + type._4_4_;
    }
    lvars = (float32 ***)
            __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)type._4_4_,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                              ,0x331);
    _continuous = (float32 ***)
                  __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)type._4_4_,4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                                    ,0x332);
  }
  pppfVar5 = (float32 ***)
             __ckd_calloc_3d__((ulong)n_state,(ulong)n_stream,(ulong)n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                               ,0x335);
  tmpptr = __ckd_calloc_2d__((ulong)n_stream,(ulong)n_density,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                             ,0x336);
  ptr = __ckd_calloc__((ulong)n_stream,8,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                       ,0x337);
  k = 0;
  do {
    if (n_state <= k) {
      local_60 = 0;
      l_id._4_4_ = 0.0;
      for (k = 0; k < n_state; k = k + 1) {
        if ((float)l_id._4_4_ < (float)stwt[k]) {
          l_id._4_4_ = stwt[k];
          local_60 = k;
        }
      }
      fVar2 = 0.0;
      for (dnom._4_4_ = 0; dnom._4_4_ < n_density; dnom._4_4_ = dnom._4_4_ + 1) {
        fVar2 = (float)(*pppfVar5[local_60])[dnom._4_4_] + fVar2;
      }
      s_wt_ent = 0.0;
      for (k = 0; k < n_state; k = k + 1) {
        for (local_60 = 0; local_60 < n_stream; local_60 = local_60 + 1) {
          dnom._4_4_ = 0;
          *(undefined8 *)((long)ptr + (ulong)local_60 * 8) = 0;
          for (; dnom._4_4_ < n_density; dnom._4_4_ = dnom._4_4_ + 1) {
            *(double *)((long)ptr + (ulong)local_60 * 8) =
                 (double)(float)pppfVar5[k][local_60][dnom._4_4_] +
                 *(double *)((long)ptr + (ulong)local_60 * 8);
          }
        }
        occ = 0.0;
        for (local_60 = 0; local_60 < n_stream; local_60 = local_60 + 1) {
          dVar8 = *(double *)((long)ptr + (ulong)local_60 * 8);
          if (bVar7) {
            dVar8 = *(double *)((long)ptr + (ulong)local_60 * 8);
            fVar9 = ent_cont(lvars[k][local_60],_continuous[k][local_60],veclen[local_60]);
            dVar8 = dVar8 * (double)fVar9;
          }
          else {
            for (dnom._4_4_ = 0; dnom._4_4_ < n_density; dnom._4_4_ = dnom._4_4_ + 1) {
              *(float *)(*(long *)((long)tmpptr + (ulong)local_60 * 8) + (ulong)dnom._4_4_ * 4) =
                   (float)((double)(float)pppfVar5[k][local_60][dnom._4_4_] * (1.0 / dVar8));
              if (*(float *)(*(long *)((long)tmpptr + (ulong)local_60 * 8) + (ulong)dnom._4_4_ * 4)
                  < (float)mwfloor) {
                *(float32 *)(*(long *)((long)tmpptr + (ulong)local_60 * 8) + (ulong)dnom._4_4_ * 4)
                     = mwfloor;
              }
            }
            dVar8 = *(double *)((long)ptr + (ulong)local_60 * 8);
            fVar9 = ent_d(*(float32 **)((long)tmpptr + (ulong)local_60 * 8),n_density);
            dVar8 = dVar8 * (double)fVar9;
          }
          occ = (float64)(dVar8 + (double)occ);
        }
        s_wt_ent = (float64)((double)(float)stwt[k] * (double)occ + (double)s_wt_ent);
      }
      node->node_id = node_id;
      puVar6 = (uint32 *)
               __ckd_calloc__((ulong)n_id,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                              ,0x38d);
      for (local_60 = 0; local_60 < n_id; local_60 = local_60 + 1) {
        puVar6[local_60] = id[local_60];
      }
      node->id = puVar6;
      node->n_id = n_id;
      node->mixw_occ = pppfVar5;
      if (bVar7) {
        node->means = lvars;
        node->vars = _continuous;
      }
      node->occ = (float32)fVar2;
      node->wt_ent = s_wt_ent;
      ckd_free_2d(tmpptr);
      ckd_free(ptr);
      return 0;
    }
    for (local_60 = 0; local_60 < n_stream; local_60 = local_60 + 1) {
      lvarvec = (float32 *)0x0;
      local_d8 = (float32 *)0x0;
      if (bVar7) {
        lvarvec = lvars[k][local_60];
        local_d8 = _continuous[k][local_60];
      }
      for (s = 0; s < n_id; s = s + 1) {
        uVar1 = id[s];
        for (dnom._4_4_ = 0; dnom._4_4_ < n_density; dnom._4_4_ = dnom._4_4_ + 1) {
          pppfVar5[k][local_60][dnom._4_4_] =
               (float32)((float)mixw[uVar1][k][local_60][dnom._4_4_] +
                        (float)pppfVar5[k][local_60][dnom._4_4_]);
        }
        if (bVar7) {
          for (dnom._4_4_ = 0; dnom._4_4_ < veclen[local_60]; dnom._4_4_ = dnom._4_4_ + 1) {
            lvarvec[dnom._4_4_] =
                 (float32)((float)*mixw[uVar1][k][local_60] *
                           (float)means[uVar1][k][local_60][dnom._4_4_] + (float)lvarvec[dnom._4_4_]
                          );
            local_d8[dnom._4_4_] =
                 (float32)((float)*mixw[uVar1][k][local_60] *
                           ((float)means[uVar1][k][local_60][dnom._4_4_] *
                            (float)means[uVar1][k][local_60][dnom._4_4_] +
                           (float)vars[uVar1][k][local_60][dnom._4_4_]) +
                          (float)local_d8[dnom._4_4_]);
          }
        }
      }
      if (bVar7) {
        if (((float)*pppfVar5[k][local_60] != 0.0) || (NAN((float)*pppfVar5[k][local_60]))) {
          for (dnom._4_4_ = 0; dnom._4_4_ < veclen[local_60]; dnom._4_4_ = dnom._4_4_ + 1) {
            lvarvec[dnom._4_4_] =
                 (float32)((float)lvarvec[dnom._4_4_] / (float)*pppfVar5[k][local_60]);
            local_d8[dnom._4_4_] =
                 (float32)(-(float)lvarvec[dnom._4_4_] * (float)lvarvec[dnom._4_4_] +
                          (float)local_d8[dnom._4_4_] / (float)*pppfVar5[k][local_60]);
            if ((float)local_d8[dnom._4_4_] < (float)sumveclen) {
              local_d8[dnom._4_4_] = (float32)sumveclen;
            }
          }
        }
        else {
          for (dnom._4_4_ = 0; dnom._4_4_ < veclen[local_60]; dnom._4_4_ = dnom._4_4_ + 1) {
            if (((float)lvarvec[dnom._4_4_] != 0.0) || (NAN((float)lvarvec[dnom._4_4_]))) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/dtree.c"
                      ,0x35c,"denominator = 0, but numerator = %f at k = %d\n",
                      (double)(float)lvarvec[dnom._4_4_],(ulong)dnom._4_4_);
              exit(1);
            }
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

int
mk_node(dtree_node_t *node,
	uint32 node_id,
	uint32 *id,
	uint32 n_id,
	float32 ****mixw,
        float32 ****means,
        float32 ****vars,
        uint32  *veclen,
	uint32 n_model,
	uint32 n_state,
	uint32 n_stream,
	uint32 n_density,
	float32 *stwt,
	float32 mwfloor)
{
    float32 ***mixw_occ, **dist;
    uint32 mm, m, s, j, k;
    float64 *dnom, norm, wt_ent, s_wt_ent, occ;
    float32 mx_wt;
    uint32 *l_id;
    float32 ***lmeans=0,***lvars=0;
    float32 varfloor=0;
    uint32 continuous, sumveclen;
    char*  type;

    type = (char *)cmd_ln_str("-ts2cbfn");
    if (strcmp(type,".semi.")!=0 && strcmp(type,".cont.") != 0)
        E_FATAL("Type %s unsupported; trees can only be built on types .semi. or .cont.\n",type);
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else 
        continuous = 0;

    if (continuous == 1) {
        varfloor = cmd_ln_float32("-varfloor");
        /* Sumveclen is overallocation, but coding is simpler */
        for (j=0,sumveclen=0; j < n_stream; j++) sumveclen += veclen[j];

        lmeans   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
        lvars   = (float32 ***) ckd_calloc_3d(n_state,n_stream,sumveclen,sizeof(float32));
    }

    mixw_occ = (float32 ***)ckd_calloc_3d(n_state, n_stream, n_density, sizeof(float32));
    dist     = (float32 **)ckd_calloc_2d(n_stream, n_density, sizeof(float32));
    dnom     = (float64 *)ckd_calloc(n_stream, sizeof(float64));

    /* Merge distributions of all the elements in a cluster for combined
       distribution */
    for (s = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
            float32 *lmeanvec=0, *lvarvec=0;
            if (continuous == 1) {
                lmeanvec = lmeans[s][j];
                lvarvec = lvars[s][j];
            }
	    for (mm = 0; mm < n_id; mm++) {
	        m = id[mm];
		for (k = 0; k < n_density; k++) {
		    mixw_occ[s][j][k] += mixw[m][s][j][k];
		}
                /* For continuous hmms we have only one gaussian per state */
                if (continuous == 1) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] += mixw[m][s][j][0] * means[m][s][j][k];
                        lvarvec[k] += mixw[m][s][j][0] * (vars[m][s][j][k] + 
                                        means[m][s][j][k] * means[m][s][j][k]);
	            }
	        }
	    }
            if (continuous == 1) {
                if (mixw_occ[s][j][0] != 0) {
                    for (k = 0; k < veclen[j]; k++) {
                        lmeanvec[k] /= mixw_occ[s][j][0];
                        lvarvec[k] = lvarvec[k]/mixw_occ[s][j][0] - 
                                            lmeanvec[k]*lmeanvec[k];
                        if (lvarvec[k] < varfloor) lvarvec[k] = varfloor;
	            }
	        }
                else {
                    for (k = 0; k < veclen[j]; k++) 
                        if (lmeanvec[k] != 0)
                            E_FATAL("denominator = 0, but numerator = %f at k = %d\n",lmeanvec[k],k);
                }
	    }
	}
    }

    /* Find out which state is under consideration */
    for (j = 0, mx_wt = 0, s = 0; s < n_state; s++) {
	if (stwt[s] > mx_wt) {
	    mx_wt = stwt[s];
	    j = s;
	}
    }

    /* occ is the same for each independent feature, so just choose 0 */
    for (k = 0, occ = 0; k < n_density; k++) {
	occ += mixw_occ[j][0][k];
    }

    for (s = 0, wt_ent = 0; s < n_state; s++) {
	for (j = 0; j < n_stream; j++) {
	    for (k = 0, dnom[j] = 0; k < n_density; k++) {
	        dnom[j] += mixw_occ[s][j][k];
	    }
	}

	for (j = 0, s_wt_ent = 0; j < n_stream; j++) {
	    norm = 1.0 / dnom[j];

            /* discrete_entropy for discrete case, continuous entropy for
               continuous HMMs */
            if (continuous != 1) {
	        for (k = 0; k < n_density; k++) {
	    	    dist[j][k] = mixw_occ[s][j][k] * norm;
		    if (dist[j][k] < mwfloor)
		        dist[j][k] = mwfloor;
	        }

	        s_wt_ent += dnom[j] * ent_d(dist[j], n_density);
            }
            else {
	        s_wt_ent += dnom[j] * ent_cont(lmeans[s][j], lvars[s][j], veclen[j]);
            }
	}

	wt_ent += stwt[s] * s_wt_ent;
    }

    node->node_id = node_id;
    l_id = ckd_calloc(n_id, sizeof(uint32));
    for (j = 0; j < n_id; j++) {
	l_id[j] = id[j];
    }
    node->id = l_id;
    node->n_id = n_id;
    node->mixw_occ = mixw_occ;
    if (continuous == 1) {
        node->means = lmeans;
        node->vars = lvars;
    }
    node->occ = occ;
    node->wt_ent = wt_ent;

    ckd_free_2d((void **)dist);
    ckd_free((void *)dnom);

    return S3_SUCCESS;
}